

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

bool __thiscall onmt::Tokenizer::Options::add_alphabet_to_segment(Options *this,string *alphabet)

{
  int iVar1;
  int code;
  undefined1 local_14 [4];
  
  iVar1 = unicode::get_script_code((alphabet->_M_dataplus)._M_p);
  if (-1 < iVar1) {
    std::
    _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<int_const&>
              ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->segment_alphabet_codes,local_14);
  }
  return -1 < iVar1;
}

Assistant:

bool Tokenizer::Options::add_alphabet_to_segment(const std::string& alphabet)
  {
    const int code = unicode::get_script_code(alphabet.c_str());
    if (code < 0)
      return false;
    segment_alphabet_codes.emplace(code);
    return true;
  }